

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O1

UBool __thiscall
icu_63::OlsonTimeZone::getNextTransition
          (OlsonTimeZone *this,UDate base,UBool inclusive,TimeZoneTransition *result)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  TimeArrayTimeZoneRule **ppTVar4;
  TimeArrayTimeZoneRule *this_00;
  TimeArrayTimeZoneRule *this_01;
  UBool UVar5;
  int16_t iVar6;
  int iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int64_t iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TimeZoneTransition *right;
  int iVar11;
  int iVar12;
  bool bVar13;
  UDate UVar14;
  UErrorCode status;
  UnicodeString toName;
  UnicodeString fromName;
  UErrorCode local_b4;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_b4 = U_ZERO_ERROR;
  checkTransitionRules(this,&local_b4);
  if (U_ZERO_ERROR < local_b4) {
    return '\0';
  }
  if (this->finalZone != (SimpleTimeZone *)0x0) {
    if (inclusive != '\0') {
      UVar14 = TimeZoneTransition::getTime(this->firstFinalTZTransition);
      if ((UVar14 == base) && (!NAN(UVar14) && !NAN(base))) {
        right = this->firstFinalTZTransition;
        goto LAB_001ebb9a;
      }
    }
    UVar14 = TimeZoneTransition::getTime(this->firstFinalTZTransition);
    if (UVar14 <= base) {
      iVar7 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[9]
              )();
      if ((char)iVar7 == '\0') {
        return '\0';
      }
      iVar7 = (*(this->finalZoneWithStartYear->super_BasicTimeZone).super_TimeZone.super_UObject.
                _vptr_UObject[0xe])
                        (base,this->finalZoneWithStartYear,(ulong)(uint)(int)inclusive,result);
      return (UBool)iVar7;
    }
  }
  ppTVar4 = this->historicRules;
  if (ppTVar4 == (TimeArrayTimeZoneRule **)0x0) {
    return '\0';
  }
  iVar7 = *(int *)&this->transitionCountPre32;
  iVar3 = *(int *)&this->transitionCountPost32;
  uVar1 = this->transitionCount32;
  iVar11 = (short)(uVar1 + (short)iVar7 + (short)iVar3) + -1;
  sVar2 = this->firstTZTransitionIdx;
  iVar6 = (int16_t)iVar11;
  bVar13 = iVar6 < sVar2;
  iVar12 = iVar11;
  if (sVar2 <= iVar6) {
    iVar10 = transitionTimeInSeconds(this,iVar6);
    if ((base <= (double)iVar10 * 1000.0) && (inclusive != '\0' || (double)iVar10 * 1000.0 != base))
    {
      iVar7 = iVar3 + (uint)uVar1 + iVar7 + -2;
      while( true ) {
        iVar12 = iVar7;
        iVar6 = (int16_t)iVar12;
        bVar13 = iVar6 < sVar2;
        if (iVar6 < sVar2) break;
        iVar10 = transitionTimeInSeconds(this,iVar6);
        if (((double)iVar10 * 1000.0 < base) ||
           (iVar7 = iVar12 + -1, inclusive == '\0' && (double)iVar10 * 1000.0 == base)) break;
      }
    }
  }
  iVar7 = (int)(short)iVar12;
  if (iVar11 == iVar7) {
    right = this->firstFinalTZTransition;
    if (right == (TimeZoneTransition *)0x0) {
      return '\0';
    }
LAB_001ebb9a:
    TimeZoneTransition::operator=(result,right);
    return '\x01';
  }
  if (bVar13) {
    right = this->firstTZTransition;
    goto LAB_001ebb9a;
  }
  this_00 = ppTVar4[this->typeMapData[(long)iVar7 + 1]];
  this_01 = ppTVar4[this->typeMapData[iVar7]];
  iVar10 = transitionTimeInSeconds(this,(short)iVar12 + 1);
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  TimeZoneRule::getName(&this_01->super_TimeZoneRule,&local_70);
  TimeZoneRule::getName(&this_00->super_TimeZoneRule,&local_b0);
  if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
    if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
      local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
      local_b0.fUnion.fFields.fLength = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    bVar13 = false;
    if ((((int)local_b0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
       (bVar13 = false, local_70.fUnion.fFields.fLength == local_b0.fUnion.fFields.fLength)) {
      UVar5 = UnicodeString::doEquals(&local_70,&local_b0,local_70.fUnion.fFields.fLength);
      bVar13 = UVar5 != '\0';
    }
  }
  else {
    bVar13 = (bool)(local_b0.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
  }
  if (bVar13 != false) {
    iVar8 = TimeZoneRule::getRawOffset(&this_01->super_TimeZoneRule);
    iVar9 = TimeZoneRule::getRawOffset(&this_00->super_TimeZoneRule);
    if (iVar8 == iVar9) {
      iVar8 = TimeZoneRule::getDSTSavings(&this_01->super_TimeZoneRule);
      iVar9 = TimeZoneRule::getDSTSavings(&this_00->super_TimeZoneRule);
      if (iVar8 == iVar9) {
        iVar7 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xe])
                          ((double)iVar10 * 1000.0,this,0,result);
        UVar5 = (UBool)iVar7;
        goto LAB_001ebd09;
      }
    }
  }
  TimeZoneTransition::setTime(result,(double)iVar10 * 1000.0);
  iVar7 = (*(this_01->super_TimeZoneRule).super_UObject._vptr_UObject[3])(this_01);
  TimeZoneTransition::adoptFrom(result,(TimeZoneRule *)CONCAT44(extraout_var,iVar7));
  iVar7 = (*(this_00->super_TimeZoneRule).super_UObject._vptr_UObject[3])(this_00);
  UVar5 = '\x01';
  TimeZoneTransition::adoptTo(result,(TimeZoneRule *)CONCAT44(extraout_var_00,iVar7));
LAB_001ebd09:
  UnicodeString::~UnicodeString(&local_b0);
  UnicodeString::~UnicodeString(&local_70);
  return UVar5;
}

Assistant:

UBool
OlsonTimeZone::getNextTransition(UDate base, UBool inclusive, TimeZoneTransition& result) const {
    UErrorCode status = U_ZERO_ERROR;
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return FALSE;
    }

    if (finalZone != NULL) {
        if (inclusive && base == firstFinalTZTransition->getTime()) {
            result = *firstFinalTZTransition;
            return TRUE;
        } else if (base >= firstFinalTZTransition->getTime()) {
            if (finalZone->useDaylightTime()) {
                //return finalZone->getNextTransition(base, inclusive, result);
                return finalZoneWithStartYear->getNextTransition(base, inclusive, result);
            } else {
                // No more transitions
                return FALSE;
            }
        }
    }
    if (historicRules != NULL) {
        // Find a historical transition
        int16_t transCount = transitionCount();
        int16_t ttidx = transCount - 1;
        for (; ttidx >= firstTZTransitionIdx; ttidx--) {
            UDate t = (UDate)transitionTime(ttidx);
            if (base > t || (!inclusive && base == t)) {
                break;
            }
        }
        if (ttidx == transCount - 1)  {
            if (firstFinalTZTransition != NULL) {
                result = *firstFinalTZTransition;
                return TRUE;
            } else {
                return FALSE;
            }
        } else if (ttidx < firstTZTransitionIdx) {
            result = *firstTZTransition;
            return TRUE;
        } else {
            // Create a TimeZoneTransition
            TimeZoneRule *to = historicRules[typeMapData[ttidx + 1]];
            TimeZoneRule *from = historicRules[typeMapData[ttidx]];
            UDate startTime = (UDate)transitionTime(ttidx+1);

            // The transitions loaded from zoneinfo.res may contain non-transition data
            UnicodeString fromName, toName;
            from->getName(fromName);
            to->getName(toName);
            if (fromName == toName && from->getRawOffset() == to->getRawOffset()
                    && from->getDSTSavings() == to->getDSTSavings()) {
                return getNextTransition(startTime, false, result);
            }
            result.setTime(startTime);
            result.adoptFrom(from->clone());
            result.adoptTo(to->clone());
            return TRUE;
        }
    }
    return FALSE;
}